

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isLinearMipmapLinearSampleResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               LookupPrecision *prec,Vec3 *coord,Vec2 *fBounds,Vec4 *result)

{
  bool bVar1;
  int dim;
  int dim_00;
  int dim_01;
  int dim_02;
  int dim_03;
  int dim_04;
  int iVar2;
  int iVar3;
  deInt32 dVar4;
  deInt32 dVar5;
  deInt32 dVar6;
  deInt32 dVar7;
  deInt32 dVar8;
  deInt32 dVar9;
  deInt32 dVar10;
  TextureChannelClass TVar11;
  int y0_00;
  int y1_00;
  int z;
  int z_00;
  TextureFormat *pTVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float y;
  float local_2f8;
  float local_2f4;
  Vector<float,_2> local_290;
  Vector<float,_2> local_288;
  Vector<float,_2> local_280;
  Vector<float,_2> local_278;
  Vector<float,_2> local_270;
  Vector<float,_2> local_268;
  float local_260;
  float local_25c;
  float maxC1;
  float minC1;
  float maxB1;
  float minB1;
  float maxA1;
  float minA1;
  int z1_1;
  int z0_1;
  int y1_1;
  int y0_1;
  int x1_1;
  int x0_1;
  float searchStep1;
  ColorQuad quad11;
  ColorQuad quad10;
  int i1;
  int j1;
  int k1;
  float maxC0;
  float minC0;
  float maxB0;
  float minB0;
  float maxA0;
  float minA0;
  int z1;
  int z0;
  int y1;
  int y0;
  int x1;
  int x0;
  float searchStep0;
  ColorQuad quad01;
  ColorQuad quad00;
  int i0;
  int j0;
  int k0;
  float cSearchStep;
  TextureChannelClass texClass;
  int maxK1;
  int minK1;
  int maxK0;
  int minK0;
  int maxJ1;
  int minJ1;
  int maxJ0;
  int minJ0;
  int maxI1;
  int minI1;
  int maxI0;
  int minI0;
  Vec2 wBounds1;
  Vec2 wBounds0;
  Vec2 vBounds1;
  Vec2 vBounds0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  int d1;
  int d0;
  int h1;
  int h0;
  int w1;
  int w0;
  Vec2 *fBounds_local;
  Vec3 *coord_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level1_local;
  ConstPixelBufferAccess *level0_local;
  
  dim = ConstPixelBufferAccess::getWidth(level0);
  dim_00 = ConstPixelBufferAccess::getWidth(level1);
  dim_01 = ConstPixelBufferAccess::getHeight(level0);
  dim_02 = ConstPixelBufferAccess::getHeight(level1);
  dim_03 = ConstPixelBufferAccess::getDepth(level0);
  dim_04 = ConstPixelBufferAccess::getDepth(level1);
  bVar1 = sampler->normalizedCoords;
  fVar13 = Vector<float,_3>::x(coord);
  iVar2 = Vector<int,_3>::x(&prec->coordBits);
  iVar3 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds1,(bool)(bVar1 & 1),dim,fVar13,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar13 = Vector<float,_3>::x(coord);
  iVar2 = Vector<int,_3>::x(&prec->coordBits);
  iVar3 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds0,(bool)(bVar1 & 1),dim_00,fVar13,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar13 = Vector<float,_3>::y(coord);
  iVar2 = Vector<int,_3>::y(&prec->coordBits);
  iVar3 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds1,(bool)(bVar1 & 1),dim_01,fVar13,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar13 = Vector<float,_3>::y(coord);
  iVar2 = Vector<int,_3>::y(&prec->coordBits);
  iVar3 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&wBounds0,(bool)(bVar1 & 1),dim_02,fVar13,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar13 = Vector<float,_3>::z(coord);
  iVar2 = Vector<int,_3>::z(&prec->coordBits);
  iVar3 = Vector<int,_3>::z(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&wBounds1,(bool)(bVar1 & 1),dim_03,fVar13,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar13 = Vector<float,_3>::z(coord);
  iVar2 = Vector<int,_3>::z(&prec->coordBits);
  iVar3 = Vector<int,_3>::z(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI0,(bool)(bVar1 & 1),dim_04,fVar13,iVar2,iVar3);
  fVar13 = Vector<float,_2>::x(&uBounds1);
  fVar13 = (float)deFloorFloatToInt32(fVar13 - 0.5);
  fVar14 = Vector<float,_2>::y(&uBounds1);
  dVar4 = deFloorFloatToInt32(fVar14 - 0.5);
  fVar14 = Vector<float,_2>::x(&vBounds0);
  fVar14 = (float)deFloorFloatToInt32(fVar14 - 0.5);
  fVar15 = Vector<float,_2>::y(&vBounds0);
  dVar5 = deFloorFloatToInt32(fVar15 - 0.5);
  fVar15 = Vector<float,_2>::x(&vBounds1);
  fVar15 = (float)deFloorFloatToInt32(fVar15 - 0.5);
  fVar16 = Vector<float,_2>::y(&vBounds1);
  dVar6 = deFloorFloatToInt32(fVar16 - 0.5);
  fVar16 = Vector<float,_2>::x(&wBounds0);
  fVar16 = (float)deFloorFloatToInt32(fVar16 - 0.5);
  fVar17 = Vector<float,_2>::y(&wBounds0);
  dVar7 = deFloorFloatToInt32(fVar17 - 0.5);
  fVar17 = Vector<float,_2>::x(&wBounds1);
  i0 = deFloorFloatToInt32(fVar17 - 0.5);
  fVar17 = Vector<float,_2>::y(&wBounds1);
  dVar8 = deFloorFloatToInt32(fVar17 - 0.5);
  fVar17 = Vector<float,_2>::x((Vector<float,_2> *)&maxI0);
  dVar9 = deFloorFloatToInt32(fVar17 - 0.5);
  fVar17 = Vector<float,_2>::y((Vector<float,_2> *)&maxI0);
  dVar10 = deFloorFloatToInt32(fVar17 - 0.5);
  pTVar12 = ConstPixelBufferAccess::getFormat(level0);
  TVar11 = getTextureChannelClass(pTVar12->type);
  if (TVar11 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    local_2f4 = computeBilinearSearchStepForUnorm(prec);
  }
  else {
    if (TVar11 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      local_2f8 = computeBilinearSearchStepForSnorm(prec);
    }
    else {
      local_2f8 = 0.0;
    }
    local_2f4 = local_2f8;
  }
  do {
    quad00.p11.m_data[3] = fVar15;
    if (dVar8 < i0) {
      return false;
    }
    for (; quad00.p11.m_data[2] = fVar13, (int)quad00.p11.m_data[3] <= dVar6;
        quad00.p11.m_data[3] = (float)((int)quad00.p11.m_data[3] + 1)) {
      for (; (int)quad00.p11.m_data[2] <= dVar4;
          quad00.p11.m_data[2] = (float)((int)quad00.p11.m_data[2] + 1)) {
        ColorQuad::ColorQuad((ColorQuad *)(quad01.p11.m_data + 2));
        ColorQuad::ColorQuad((ColorQuad *)&x0);
        iVar2 = TexVerifierUtil::wrap(sampler->wrapS,(int)quad00.p11.m_data[2],dim);
        iVar3 = TexVerifierUtil::wrap(sampler->wrapS,(int)quad00.p11.m_data[2] + 1,dim);
        y0_00 = TexVerifierUtil::wrap(sampler->wrapT,(int)quad00.p11.m_data[3],dim_01);
        y1_00 = TexVerifierUtil::wrap(sampler->wrapT,(int)quad00.p11.m_data[3] + 1,dim_01);
        z = TexVerifierUtil::wrap(sampler->wrapR,i0,dim_03);
        z_00 = TexVerifierUtil::wrap(sampler->wrapR,i0 + 1,dim_03);
        lookupQuad((ColorQuad *)(quad01.p11.m_data + 2),level0,sampler,iVar2,iVar3,y0_00,y1_00,z);
        lookupQuad((ColorQuad *)&x0,level0,sampler,iVar2,iVar3,y0_00,y1_00,z_00);
        if (TVar11 == TEXTURECHANNELCLASS_FLOATING_POINT) {
          fVar17 = computeBilinearSearchStepFromFloatQuad(prec,(ColorQuad *)(quad01.p11.m_data + 2))
          ;
          fVar18 = computeBilinearSearchStepFromFloatQuad(prec,(ColorQuad *)&x0);
          x1 = (int)de::min<float>(fVar17,fVar18);
        }
        else {
          x1 = (int)local_2f4;
        }
        fVar17 = Vector<float,_2>::x(&uBounds1);
        fVar17 = de::clamp<float>((fVar17 - 0.5) - (float)(int)quad00.p11.m_data[2],0.0,1.0);
        fVar18 = Vector<float,_2>::y(&uBounds1);
        fVar18 = de::clamp<float>((fVar18 - 0.5) - (float)(int)quad00.p11.m_data[2],0.0,1.0);
        fVar19 = Vector<float,_2>::x(&vBounds1);
        fVar19 = de::clamp<float>((fVar19 - 0.5) - (float)(int)quad00.p11.m_data[3],0.0,1.0);
        fVar20 = Vector<float,_2>::y(&vBounds1);
        fVar20 = de::clamp<float>((fVar20 - 0.5) - (float)(int)quad00.p11.m_data[3],0.0,1.0);
        fVar21 = Vector<float,_2>::x(&wBounds1);
        fVar21 = de::clamp<float>((fVar21 - 0.5) - (float)i0,0.0,1.0);
        fVar22 = Vector<float,_2>::y(&wBounds1);
        fVar22 = de::clamp<float>((fVar22 - 0.5) - (float)i0,0.0,1.0);
        for (i1 = dVar9; quad10.p11.m_data[3] = fVar16, i1 <= dVar10; i1 = i1 + 1) {
          for (; quad10.p11.m_data[2] = fVar14, (int)quad10.p11.m_data[3] <= dVar7;
              quad10.p11.m_data[3] = (float)((int)quad10.p11.m_data[3] + 1)) {
            for (; (int)quad10.p11.m_data[2] <= dVar5;
                quad10.p11.m_data[2] = (float)((int)quad10.p11.m_data[2] + 1)) {
              ColorQuad::ColorQuad((ColorQuad *)(quad11.p11.m_data + 2));
              ColorQuad::ColorQuad((ColorQuad *)&x0_1);
              y0_1 = TexVerifierUtil::wrap(sampler->wrapS,(int)quad10.p11.m_data[2],dim_00);
              y1_1 = TexVerifierUtil::wrap(sampler->wrapS,(int)quad10.p11.m_data[2] + 1,dim_00);
              z0_1 = TexVerifierUtil::wrap(sampler->wrapT,(int)quad10.p11.m_data[3],dim_02);
              z1_1 = TexVerifierUtil::wrap(sampler->wrapT,(int)quad10.p11.m_data[3] + 1,dim_02);
              minA1 = (float)TexVerifierUtil::wrap(sampler->wrapR,i1,dim_04);
              maxA1 = (float)TexVerifierUtil::wrap(sampler->wrapR,i1 + 1,dim_04);
              lookupQuad((ColorQuad *)(quad11.p11.m_data + 2),level1,sampler,y0_1,y1_1,z0_1,z1_1,
                         (int)minA1);
              lookupQuad((ColorQuad *)&x0_1,level1,sampler,y0_1,y1_1,z0_1,z1_1,(int)maxA1);
              if (TVar11 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                fVar23 = computeBilinearSearchStepFromFloatQuad
                                   (prec,(ColorQuad *)(quad11.p11.m_data + 2));
                y = computeBilinearSearchStepFromFloatQuad(prec,(ColorQuad *)&x0_1);
                x1_1 = (int)de::min<float>(fVar23,y);
              }
              else {
                x1_1 = (int)local_2f4;
              }
              fVar23 = Vector<float,_2>::x(&vBounds0);
              minB1 = de::clamp<float>((fVar23 - 0.5) - (float)(int)quad10.p11.m_data[2],0.0,1.0);
              fVar23 = Vector<float,_2>::y(&vBounds0);
              maxB1 = de::clamp<float>((fVar23 - 0.5) - (float)(int)quad10.p11.m_data[2],0.0,1.0);
              fVar23 = Vector<float,_2>::x(&wBounds0);
              minC1 = de::clamp<float>((fVar23 - 0.5) - (float)(int)quad10.p11.m_data[3],0.0,1.0);
              fVar23 = Vector<float,_2>::y(&wBounds0);
              maxC1 = de::clamp<float>((fVar23 - 0.5) - (float)(int)quad10.p11.m_data[3],0.0,1.0);
              fVar23 = Vector<float,_2>::x((Vector<float,_2> *)&maxI0);
              local_25c = de::clamp<float>((fVar23 - 0.5) - (float)i1,0.0,1.0);
              fVar23 = Vector<float,_2>::y((Vector<float,_2> *)&maxI0);
              local_260 = de::clamp<float>((fVar23 - 0.5) - (float)i1,0.0,1.0);
              Vector<float,_2>::Vector(&local_268,fVar17,fVar18);
              Vector<float,_2>::Vector(&local_270,fVar19,fVar20);
              Vector<float,_2>::Vector(&local_278,fVar21,fVar22);
              Vector<float,_2>::Vector(&local_280,minB1,maxB1);
              Vector<float,_2>::Vector(&local_288,minC1,maxC1);
              Vector<float,_2>::Vector(&local_290,local_25c,local_260);
              fVar23 = de::min<float>((float)x1,(float)x1_1);
              bVar1 = is3DTrilinearFilterResultValid
                                (prec,(ColorQuad *)(quad01.p11.m_data + 2),(ColorQuad *)&x0,
                                 (ColorQuad *)(quad11.p11.m_data + 2),(ColorQuad *)&x0_1,&local_268,
                                 &local_270,&local_278,&local_280,&local_288,&local_290,fBounds,
                                 fVar23,result);
              if (bVar1) {
                return true;
              }
            }
          }
        }
      }
    }
    i0 = i0 + 1;
  } while( true );
}

Assistant:

static bool isLinearMipmapLinearSampleResultValid (const ConstPixelBufferAccess&	level0,
												   const ConstPixelBufferAccess&	level1,
												   const Sampler&					sampler,
												   const LookupPrecision&			prec,
												   const Vec3&						coord,
												   const Vec2&						fBounds,
												   const Vec4&						result)
{
	// \todo [2013-07-04 pyry] This is strictly not correct as coordinates between levels should be dependent.
	//						   Right now this allows pairing any two valid bilinear quads.

	const int					w0				= level0.getWidth();
	const int					w1				= level1.getWidth();
	const int					h0				= level0.getHeight();
	const int					h1				= level1.getHeight();
	const int					d0				= level0.getDepth();
	const int					d1				= level1.getDepth();

	const Vec2					uBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w0,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2					uBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w1,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2					vBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h0,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2					vBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h1,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2					wBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, d0,	coord.z(), prec.coordBits.z(), prec.uvwBits.z());
	const Vec2					wBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, d1,	coord.z(), prec.coordBits.z(), prec.uvwBits.z());

	// Integer coordinates - without wrap mode
	const int					minI0			= deFloorFloatToInt32(uBounds0.x()-0.5f);
	const int					maxI0			= deFloorFloatToInt32(uBounds0.y()-0.5f);
	const int					minI1			= deFloorFloatToInt32(uBounds1.x()-0.5f);
	const int					maxI1			= deFloorFloatToInt32(uBounds1.y()-0.5f);
	const int					minJ0			= deFloorFloatToInt32(vBounds0.x()-0.5f);
	const int					maxJ0			= deFloorFloatToInt32(vBounds0.y()-0.5f);
	const int					minJ1			= deFloorFloatToInt32(vBounds1.x()-0.5f);
	const int					maxJ1			= deFloorFloatToInt32(vBounds1.y()-0.5f);
	const int					minK0			= deFloorFloatToInt32(wBounds0.x()-0.5f);
	const int					maxK0			= deFloorFloatToInt32(wBounds0.y()-0.5f);
	const int					minK1			= deFloorFloatToInt32(wBounds1.x()-0.5f);
	const int					maxK1			= deFloorFloatToInt32(wBounds1.y()-0.5f);

	const TextureChannelClass	texClass		= getTextureChannelClass(level0.getFormat().type);
	const float					cSearchStep		= texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	? computeBilinearSearchStepForUnorm(prec) :
												  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	? computeBilinearSearchStepForSnorm(prec) :
												  0.0f; // Step is computed for floating-point quads based on texel values.

	DE_ASSERT(texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_FLOATING_POINT);

	for (int k0 = minK0; k0 <= maxK0; k0++)
	{
		for (int j0 = minJ0; j0 <= maxJ0; j0++)
		{
			for (int i0 = minI0; i0 <= maxI0; i0++)
			{
				ColorQuad	quad00, quad01;
				float		searchStep0;

				{
					const int	x0		= wrap(sampler.wrapS, i0  , w0);
					const int	x1		= wrap(sampler.wrapS, i0+1, w0);
					const int	y0		= wrap(sampler.wrapT, j0  , h0);
					const int	y1		= wrap(sampler.wrapT, j0+1, h0);
					const int	z0		= wrap(sampler.wrapR, k0  , d0);
					const int	z1		= wrap(sampler.wrapR, k0+1, d0);
					lookupQuad(quad00, level0, sampler, x0, x1, y0, y1, z0);
					lookupQuad(quad01, level0, sampler, x0, x1, y0, y1, z1);

					if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
						searchStep0 = de::min(computeBilinearSearchStepFromFloatQuad(prec, quad00), computeBilinearSearchStepFromFloatQuad(prec, quad01));
					else
						searchStep0 = cSearchStep;
				}

				const float	minA0	= de::clamp((uBounds0.x()-0.5f)-float(i0), 0.0f, 1.0f);
				const float	maxA0	= de::clamp((uBounds0.y()-0.5f)-float(i0), 0.0f, 1.0f);
				const float	minB0	= de::clamp((vBounds0.x()-0.5f)-float(j0), 0.0f, 1.0f);
				const float	maxB0	= de::clamp((vBounds0.y()-0.5f)-float(j0), 0.0f, 1.0f);
				const float	minC0	= de::clamp((wBounds0.x()-0.5f)-float(k0), 0.0f, 1.0f);
				const float	maxC0	= de::clamp((wBounds0.y()-0.5f)-float(k0), 0.0f, 1.0f);

				for (int k1 = minK1; k1 <= maxK1; k1++)
				{
					for (int j1 = minJ1; j1 <= maxJ1; j1++)
					{
						for (int i1 = minI1; i1 <= maxI1; i1++)
						{
							ColorQuad	quad10, quad11;
							float		searchStep1;

							{
								const int	x0		= wrap(sampler.wrapS, i1  , w1);
								const int	x1		= wrap(sampler.wrapS, i1+1, w1);
								const int	y0		= wrap(sampler.wrapT, j1  , h1);
								const int	y1		= wrap(sampler.wrapT, j1+1, h1);
								const int	z0		= wrap(sampler.wrapR, k1  , d1);
								const int	z1		= wrap(sampler.wrapR, k1+1, d1);
								lookupQuad(quad10, level1, sampler, x0, x1, y0, y1, z0);
								lookupQuad(quad11, level1, sampler, x0, x1, y0, y1, z1);

								if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
									searchStep1 = de::min(computeBilinearSearchStepFromFloatQuad(prec, quad10), computeBilinearSearchStepFromFloatQuad(prec, quad11));
								else
									searchStep1 = cSearchStep;
							}

							const float	minA1	= de::clamp((uBounds1.x()-0.5f)-float(i1), 0.0f, 1.0f);
							const float	maxA1	= de::clamp((uBounds1.y()-0.5f)-float(i1), 0.0f, 1.0f);
							const float	minB1	= de::clamp((vBounds1.x()-0.5f)-float(j1), 0.0f, 1.0f);
							const float	maxB1	= de::clamp((vBounds1.y()-0.5f)-float(j1), 0.0f, 1.0f);
							const float	minC1	= de::clamp((wBounds1.x()-0.5f)-float(k1), 0.0f, 1.0f);
							const float	maxC1	= de::clamp((wBounds1.y()-0.5f)-float(k1), 0.0f, 1.0f);

							if (is3DTrilinearFilterResultValid(prec, quad00, quad01, quad10, quad11,
															   Vec2(minA0, maxA0), Vec2(minB0, maxB0), Vec2(minC0, maxC0),
															   Vec2(minA1, maxA1), Vec2(minB1, maxB1), Vec2(minC1, maxC1),
															   fBounds, de::min(searchStep0, searchStep1), result))
								return true;
						}
					}
				}
			}
		}
	}

	return false;
}